

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround
          (CompilerGLSL *this,string *func,Op op,GroupOperation group_op)

{
  bool bVar1;
  CompilerError *pCVar2;
  reference ts;
  bool local_e32;
  bool local_e31;
  TypeInfo *t;
  iterator __end1;
  iterator __begin1;
  vector<TypeInfo,_std::allocator<TypeInfo>_> *__range1;
  string op_symbol;
  allocator local_9b1;
  string local_9b0 [4];
  bool op_is_multiplication;
  bool op_is_addition;
  undefined1 local_98b;
  allocator local_98a;
  allocator local_989;
  TypeInfo local_988;
  undefined1 local_943;
  allocator local_942;
  allocator local_941;
  TypeInfo local_940;
  undefined1 local_8fb;
  allocator local_8fa;
  allocator local_8f9;
  TypeInfo local_8f8;
  undefined1 local_8b3;
  allocator local_8b2;
  allocator local_8b1;
  TypeInfo local_8b0;
  undefined1 local_86b;
  allocator local_86a;
  allocator local_869;
  TypeInfo local_868;
  undefined1 local_823;
  allocator local_822;
  allocator local_821;
  TypeInfo local_820;
  undefined1 local_7db;
  allocator local_7da;
  allocator local_7d9;
  TypeInfo local_7d8;
  undefined1 local_793;
  allocator local_792;
  allocator local_791;
  TypeInfo local_790;
  undefined1 local_74b;
  allocator local_74a;
  allocator local_749;
  TypeInfo local_748;
  undefined1 local_703;
  allocator local_702;
  allocator local_701;
  TypeInfo local_700;
  undefined1 local_6bb;
  allocator local_6ba;
  allocator local_6b9;
  TypeInfo local_6b8;
  undefined1 local_673;
  allocator local_672;
  allocator local_671;
  TypeInfo local_670;
  undefined1 local_62b;
  allocator local_62a;
  allocator local_629;
  TypeInfo local_628;
  undefined1 local_5e3;
  allocator local_5e2;
  allocator local_5e1;
  TypeInfo local_5e0;
  undefined1 local_59b;
  allocator local_59a;
  allocator local_599;
  TypeInfo local_598;
  undefined1 local_553;
  allocator local_552;
  allocator local_551;
  TypeInfo local_550;
  undefined1 local_50b;
  allocator local_50a;
  allocator local_509;
  TypeInfo local_508;
  undefined1 local_4c3;
  allocator local_4c2;
  allocator local_4c1;
  TypeInfo local_4c0;
  undefined1 local_47b;
  allocator local_47a;
  allocator local_479;
  TypeInfo local_478;
  undefined1 local_433;
  allocator local_432;
  allocator local_431;
  TypeInfo local_430;
  undefined1 local_3eb;
  allocator local_3ea;
  allocator local_3e9;
  TypeInfo local_3e8;
  undefined1 local_3a3;
  allocator local_3a2;
  allocator local_3a1;
  TypeInfo local_3a0;
  undefined1 local_35b;
  allocator local_35a;
  allocator local_359;
  TypeInfo local_358;
  undefined1 local_313;
  allocator local_312;
  allocator local_311;
  TypeInfo local_310;
  undefined1 local_2cb;
  allocator local_2ca;
  allocator local_2c9;
  TypeInfo local_2c8;
  undefined1 local_283;
  allocator local_282;
  allocator local_281;
  TypeInfo local_280;
  undefined1 local_23b;
  allocator local_23a;
  allocator local_239;
  TypeInfo local_238;
  undefined1 local_1f3;
  allocator local_1f2;
  allocator local_1f1;
  TypeInfo local_1f0;
  undefined1 local_1ab;
  allocator local_1aa;
  allocator local_1a9;
  TypeInfo local_1a8;
  undefined1 local_163;
  allocator local_162;
  allocator local_161;
  TypeInfo local_160;
  undefined1 local_11b;
  allocator local_11a;
  allocator local_119;
  TypeInfo local_118;
  undefined1 local_d3;
  allocator local_d2;
  allocator local_d1;
  TypeInfo local_d0;
  undefined1 local_90 [8];
  vector<TypeInfo,_std::allocator<TypeInfo>_> type_infos;
  string local_70 [48];
  string local_40 [8];
  string result;
  GroupOperation group_op_local;
  Op op_local;
  string *func_local;
  CompilerGLSL *this_local;
  
  ::std::__cxx11::string::string(local_40);
  if (group_op == GroupOperationReduce) {
    ::std::__cxx11::string::operator=(local_40,"reduction");
  }
  else if (group_op == GroupOperationInclusiveScan) {
    ::std::__cxx11::string::operator=(local_40,"incl_scan");
  }
  else {
    if (group_op != GroupOperationExclusiveScan) {
      type_infos.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,"Unsupported workaround for arithmetic group operation",
                 (allocator *)
                 ((long)&type_infos.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      CompilerError::CompilerError(pCVar2,(string *)local_70);
      type_infos.super__Vector_base<TypeInfo,_std::allocator<TypeInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=(local_40,"excl_scan");
  }
  ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::vector
            ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_90);
  switch(op) {
  case OpGroupNonUniformIAdd:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_d0,"uint",&local_d1);
    local_d3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_d0.identity,"0u",&local_d2);
    local_d3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_d0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_d2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_118,"uvec2",&local_119);
    local_11b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_118.identity,"uvec2(0u)",&local_11a);
    local_11b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_118);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_118);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_11a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_160,"uvec3",&local_161);
    local_163 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_160.identity,"uvec3(0u)",&local_162);
    local_163 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_160);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_160);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_162);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_161);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1a8,"uvec4",&local_1a9);
    local_1ab = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1a8.identity,"uvec4(0u)",&local_1aa);
    local_1ab = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_1a8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_1a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1aa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1f0,"int",&local_1f1);
    local_1f3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1f0.identity,"0",&local_1f2);
    local_1f3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_1f0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_1f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_238,"ivec2",&local_239);
    local_23b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_238.identity,"ivec2(0)",&local_23a);
    local_23b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_238);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_238);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_23a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_239);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_280,"ivec3",&local_281);
    local_283 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_280.identity,"ivec3(0)",&local_282);
    local_283 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_280);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_280);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_282);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2c8,"ivec4",&local_2c9);
    local_2cb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2c8.identity,"ivec4(0)",&local_2ca);
    local_2cb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_2c8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_2c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2ca);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    break;
  case OpGroupNonUniformFAdd:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_310,"float",&local_311);
    local_313 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_310.identity,"0.0f",&local_312);
    local_313 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_310);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_310);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_312);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_358,"vec2",&local_359);
    local_35b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_358.identity,"vec2(0.0f)",&local_35a);
    local_35b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_358);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_358);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_35a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_359);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3a0,"vec3",&local_3a1);
    local_3a3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3a0.identity,"vec3(0.0f)",&local_3a2);
    local_3a3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_3a0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_3a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3e8,"vec4",&local_3e9);
    local_3eb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3e8.identity,"vec4(0.0f)",&local_3ea);
    local_3eb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_3e8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_3e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3ea);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_430,"double",&local_431);
    local_433 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_430.identity,"0.0LF",&local_432);
    local_433 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_430);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_430);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_432);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_431);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_478,"dvec2",&local_479);
    local_47b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_478.identity,"dvec2(0.0LF)",&local_47a);
    local_47b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_478);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_478);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_47a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_479);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_4c0,"dvec3",&local_4c1);
    local_4c3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_4c0.identity,"dvec3(0.0LF)",&local_4c2);
    local_4c3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_4c0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_4c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_508,"dvec4",&local_509);
    local_50b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_508.identity,"dvec4(0.0LF)",&local_50a);
    local_50b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_508);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_508);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_50a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_509);
    break;
  case OpGroupNonUniformIMul:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_550,"uint",&local_551);
    local_553 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_550.identity,"1u",&local_552);
    local_553 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_550);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_550);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_552);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_551);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_598,"uvec2",&local_599);
    local_59b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_598.identity,"uvec2(1u)",&local_59a);
    local_59b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_598);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_598);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_599);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5e0,"uvec3",&local_5e1);
    local_5e3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5e0.identity,"uvec3(1u)",&local_5e2);
    local_5e3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_5e0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_5e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5e2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_628,"uvec4",&local_629);
    local_62b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_628.identity,"uvec4(1u)",&local_62a);
    local_62b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_628);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_628);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_62a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_629);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_670,"int",&local_671);
    local_673 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_670.identity,"1",&local_672);
    local_673 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_670);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_670);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_672);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_671);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6b8,"ivec2",&local_6b9);
    local_6bb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6b8.identity,"ivec2(1)",&local_6ba);
    local_6bb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_6b8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_6b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6ba);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_700,"ivec3",&local_701);
    local_703 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_700.identity,"ivec3(1)",&local_702);
    local_703 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_700);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_700);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_702);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_701);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_748,"ivec4",&local_749);
    local_74b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_748.identity,"ivec4(1)",&local_74a);
    local_74b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_748);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_748);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_74a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_749);
    break;
  case OpGroupNonUniformFMul:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_790,"float",&local_791);
    local_793 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_790.identity,"1.0f",&local_792);
    local_793 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_790);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_790);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_792);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_791);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7d8,"vec2",&local_7d9);
    local_7db = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7d8.identity,"vec2(1.0f)",&local_7da);
    local_7db = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_7d8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_7d8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7da);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_820,"vec3",&local_821);
    local_823 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_820.identity,"vec3(1.0f)",&local_822);
    local_823 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_820);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_820);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_822);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_821);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_868,"vec4",&local_869);
    local_86b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_868.identity,"vec4(1.0f)",&local_86a);
    local_86b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_868);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_868);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_86a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_869);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8b0,"double",&local_8b1);
    local_8b3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8b0.identity,"0.0LF",&local_8b2);
    local_8b3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_8b0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_8b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8b2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8f8,"dvec2",&local_8f9);
    local_8fb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8f8.identity,"dvec2(1.0LF)",&local_8fa);
    local_8fb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_8f8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_8f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8fa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_940,"dvec3",&local_941);
    local_943 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_940.identity,"dvec3(1.0LF)",&local_942);
    local_943 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_940);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_940);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_942);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_941);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_988,"dvec4",&local_989);
    local_98b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_988.identity,"dvec4(1.0LF)",&local_98a);
    local_98b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_90,&local_988);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_988);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_98a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_989);
    break;
  default:
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_9b0,"Unsupported workaround for arithmetic group operation",&local_9b1);
    CompilerError::CompilerError(pCVar2,(string *)local_9b0);
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  local_e31 = op == OpGroupNonUniformIAdd || op == OpGroupNonUniformFAdd;
  local_e32 = op == OpGroupNonUniformIMul || op == OpGroupNonUniformFMul;
  ::std::__cxx11::string::string((string *)&__range1);
  if (op == OpGroupNonUniformIAdd || op == OpGroupNonUniformFAdd) {
    ::std::__cxx11::string::operator=((string *)&__range1,"+=");
  }
  else if (op == OpGroupNonUniformIMul || op == OpGroupNonUniformFMul) {
    ::std::__cxx11::string::operator=((string *)&__range1,"*=");
  }
  __end1 = ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::begin
                     ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_90);
  t = (TypeInfo *)
      ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::end
                ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_90);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<TypeInfo_*,_std::vector<TypeInfo,_std::allocator<TypeInfo>_>_>
                                     *)&t), bVar1) {
    ts = __gnu_cxx::__normal_iterator<TypeInfo_*,_std::vector<TypeInfo,_std::allocator<TypeInfo>_>_>
         ::operator*(&__end1);
    statement<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[4]>
              (this,&ts->type,(char (*) [2])0x5eb360,func,(char (*) [2])0x601bd3,&ts->type,
               (char (*) [4])0x5ee068);
    begin_scope(this);
    statement<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
              (this,&ts->type,(char (*) [2])0x5eb360,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [4])0x601511,&ts->identity,(char (*) [2])0x5e9b70);
    statement<char_const(&)[45]>(this,(char (*) [45])"uvec4 active_threads = subgroupBallot(true);")
    ;
    statement<char_const(&)[63]>
              (this,(char (*) [63])"if (subgroupBallotBitCount(active_threads) == gl_SubgroupSize)")
    ;
    begin_scope(this);
    statement<char_const(&)[35]>(this,(char (*) [35])"uint total = gl_SubgroupSize / 2u;");
    statement<std::__cxx11::string&,char_const(&)[6]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [6])" = v;");
    statement<char_const(&)[40]>(this,(char (*) [40])"for (uint i = 1u; i <= total; i <<= 1u)");
    begin_scope(this);
    statement<char_const(&)[12]>(this,(char (*) [12])"bool valid;");
    if (group_op == GroupOperationReduce) {
      statement<std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string&,char_const(&)[30]>
                (this,&ts->type,(char (*) [19])" s = shuffleXorNV(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [30])", i, gl_SubgroupSize, valid);");
    }
    else if ((group_op == GroupOperationExclusiveScan) || (group_op == GroupOperationInclusiveScan))
    {
      statement<std::__cxx11::string_const&,char_const(&)[18],std::__cxx11::string&,char_const(&)[30]>
                (this,&ts->type,(char (*) [18])" s = shuffleUpNV(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [30])", i, gl_SubgroupSize, valid);");
    }
    if ((local_e31) || (local_e32)) {
      statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [2])0x5eb360,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (char (*) [14])" valid ? s : ",&ts->identity,(char (*) [2])0x5e9b70);
    }
    end_scope(this);
    if (group_op == GroupOperationExclusiveScan) {
      statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[24]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [16])0x5e4470,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [24])", 1u, gl_SubgroupSize);");
      statement<char_const(&)[21]>(this,(char (*) [21])"if (subgroupElect())");
      begin_scope(this);
      statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [4])0x601511,&ts->identity,(char (*) [2])0x5e9b70);
      end_scope(this);
    }
    end_scope(this);
    statement<char_const(&)[5]>(this,(char (*) [5])0x5e1afc);
    begin_scope(this);
    if (group_op == GroupOperationExclusiveScan) {
      statement<char_const(&)[56]>
                (this,(char (*) [56])"uint total = subgroupBallotBitCount(gl_SubgroupLtMask);");
    }
    else if (group_op == GroupOperationInclusiveScan) {
      statement<char_const(&)[56]>
                (this,(char (*) [56])"uint total = subgroupBallotBitCount(gl_SubgroupLeMask);");
    }
    statement<char_const(&)[44]>(this,(char (*) [44])"for (uint i = 0u; i < gl_SubgroupSize; ++i)");
    begin_scope(this);
    statement<char_const(&)[58]>
              (this,(char (*) [58])"bool valid = subgroupBallotBitExtract(active_threads, i);");
    statement<std::__cxx11::string_const&,char_const(&)[39]>
              (this,&ts->type,(char (*) [39])" s = shuffleNV(v, i, gl_SubgroupSize);");
    if ((group_op == GroupOperationExclusiveScan) || (group_op == GroupOperationInclusiveScan)) {
      statement<char_const(&)[30]>(this,(char (*) [30])"valid = valid && (i < total);");
    }
    if ((local_e31) || (local_e32)) {
      statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [2])0x5eb360,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (char (*) [14])" valid ? s : ",&ts->identity,(char (*) [2])0x5e9b70);
    }
    end_scope(this);
    end_scope(this);
    statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [8])"return ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x5e9b70);
    end_scope(this);
    __gnu_cxx::__normal_iterator<TypeInfo_*,_std::vector<TypeInfo,_std::allocator<TypeInfo>_>_>::
    operator++(&__end1);
  }
  ::std::__cxx11::string::~string((string *)&__range1);
  ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::~vector
            ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_90);
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void CompilerGLSL::emit_subgroup_arithmetic_workaround(const std::string &func, Op op, GroupOperation group_op)
{
	std::string result;
	switch (group_op)
	{
	case GroupOperationReduce:
		result = "reduction";
		break;

	case GroupOperationExclusiveScan:
		result = "excl_scan";
		break;

	case GroupOperationInclusiveScan:
		result = "incl_scan";
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported workaround for arithmetic group operation");
	}

	struct TypeInfo
	{
		std::string type;
		std::string identity;
	};

	std::vector<TypeInfo> type_infos;
	switch (op)
	{
	case OpGroupNonUniformIAdd:
	{
		type_infos.emplace_back(TypeInfo{ "uint", "0u" });
		type_infos.emplace_back(TypeInfo{ "uvec2", "uvec2(0u)" });
		type_infos.emplace_back(TypeInfo{ "uvec3", "uvec3(0u)" });
		type_infos.emplace_back(TypeInfo{ "uvec4", "uvec4(0u)" });
		type_infos.emplace_back(TypeInfo{ "int", "0" });
		type_infos.emplace_back(TypeInfo{ "ivec2", "ivec2(0)" });
		type_infos.emplace_back(TypeInfo{ "ivec3", "ivec3(0)" });
		type_infos.emplace_back(TypeInfo{ "ivec4", "ivec4(0)" });
		break;
	}

	case OpGroupNonUniformFAdd:
	{
		type_infos.emplace_back(TypeInfo{ "float", "0.0f" });
		type_infos.emplace_back(TypeInfo{ "vec2", "vec2(0.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec3", "vec3(0.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec4", "vec4(0.0f)" });
		// ARB_gpu_shader_fp64 is required in GL4.0 which in turn is required by NV_thread_shuffle
		type_infos.emplace_back(TypeInfo{ "double", "0.0LF" });
		type_infos.emplace_back(TypeInfo{ "dvec2", "dvec2(0.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec3", "dvec3(0.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec4", "dvec4(0.0LF)" });
		break;
	}

	case OpGroupNonUniformIMul:
	{
		type_infos.emplace_back(TypeInfo{ "uint", "1u" });
		type_infos.emplace_back(TypeInfo{ "uvec2", "uvec2(1u)" });
		type_infos.emplace_back(TypeInfo{ "uvec3", "uvec3(1u)" });
		type_infos.emplace_back(TypeInfo{ "uvec4", "uvec4(1u)" });
		type_infos.emplace_back(TypeInfo{ "int", "1" });
		type_infos.emplace_back(TypeInfo{ "ivec2", "ivec2(1)" });
		type_infos.emplace_back(TypeInfo{ "ivec3", "ivec3(1)" });
		type_infos.emplace_back(TypeInfo{ "ivec4", "ivec4(1)" });
		break;
	}

	case OpGroupNonUniformFMul:
	{
		type_infos.emplace_back(TypeInfo{ "float", "1.0f" });
		type_infos.emplace_back(TypeInfo{ "vec2", "vec2(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec3", "vec3(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec4", "vec4(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "double", "0.0LF" });
		type_infos.emplace_back(TypeInfo{ "dvec2", "dvec2(1.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec3", "dvec3(1.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec4", "dvec4(1.0LF)" });
		break;
	}

	default:
		SPIRV_CROSS_THROW("Unsupported workaround for arithmetic group operation");
	}

	const bool op_is_addition = op == OpGroupNonUniformIAdd || op == OpGroupNonUniformFAdd;
	const bool op_is_multiplication = op == OpGroupNonUniformIMul || op == OpGroupNonUniformFMul;
	std::string op_symbol;
	if (op_is_addition)
	{
		op_symbol = "+=";
	}
	else if (op_is_multiplication)
	{
		op_symbol = "*=";
	}

	for (const TypeInfo &t : type_infos)
	{
		statement(t.type, " ", func, "(", t.type, " v)");
		begin_scope();
		statement(t.type, " ", result, " = ", t.identity, ";");
		statement("uvec4 active_threads = subgroupBallot(true);");
		statement("if (subgroupBallotBitCount(active_threads) == gl_SubgroupSize)");
		begin_scope();
		statement("uint total = gl_SubgroupSize / 2u;");
		statement(result, " = v;");
		statement("for (uint i = 1u; i <= total; i <<= 1u)");
		begin_scope();
		statement("bool valid;");
		if (group_op == GroupOperationReduce)
		{
			statement(t.type, " s = shuffleXorNV(", result, ", i, gl_SubgroupSize, valid);");
		}
		else if (group_op == GroupOperationExclusiveScan || group_op == GroupOperationInclusiveScan)
		{
			statement(t.type, " s = shuffleUpNV(", result, ", i, gl_SubgroupSize, valid);");
		}
		if (op_is_addition || op_is_multiplication)
		{
			statement(result, " ", op_symbol, " valid ? s : ", t.identity, ";");
		}
		end_scope();
		if (group_op == GroupOperationExclusiveScan)
		{
			statement(result, " = shuffleUpNV(", result, ", 1u, gl_SubgroupSize);");
			statement("if (subgroupElect())");
			begin_scope();
			statement(result, " = ", t.identity, ";");
			end_scope();
		}
		end_scope();
		statement("else");
		begin_scope();
		if (group_op == GroupOperationExclusiveScan)
		{
			statement("uint total = subgroupBallotBitCount(gl_SubgroupLtMask);");
		}
		else if (group_op == GroupOperationInclusiveScan)
		{
			statement("uint total = subgroupBallotBitCount(gl_SubgroupLeMask);");
		}
		statement("for (uint i = 0u; i < gl_SubgroupSize; ++i)");
		begin_scope();
		statement("bool valid = subgroupBallotBitExtract(active_threads, i);");
		statement(t.type, " s = shuffleNV(v, i, gl_SubgroupSize);");
		if (group_op == GroupOperationExclusiveScan || group_op == GroupOperationInclusiveScan)
		{
			statement("valid = valid && (i < total);");
		}
		if (op_is_addition || op_is_multiplication)
		{
			statement(result, " ", op_symbol, " valid ? s : ", t.identity, ";");
		}
		end_scope();
		end_scope();
		statement("return ", result, ";");
		end_scope();
	}
}